

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O0

QRect __thiscall QAccessibleTableCell::rect(QAccessibleTableCell *this)

{
  QRect QVar1;
  bool bVar2;
  ulong uVar3;
  QAbstractItemView *pQVar4;
  QWidget *this_00;
  QWidget *parent;
  long *in_RDI;
  long in_FS_OFFSET;
  QRect r;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  QRect *in_stack_ffffffffffffff60;
  QPoint *in_stack_ffffffffffffff68;
  QWidget *in_stack_ffffffffffffff80;
  QPersistentModelIndex local_40 [3];
  QRect local_28;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QRect::QRect(in_stack_ffffffffffffff60);
  uVar3 = (**(code **)(*in_RDI + 0x10))();
  QVar1.x2.m_i = local_18._8_4_;
  QVar1.y2.m_i = local_18._12_4_;
  QVar1.x1.m_i = local_18._0_4_;
  QVar1.y1.m_i = local_18._4_4_;
  if ((uVar3 & 1) != 0) {
    pQVar4 = QPointer<QAbstractItemView>::operator->((QPointer<QAbstractItemView> *)0x7f9988);
    QPersistentModelIndex::operator_cast_to_QModelIndex(local_40);
    local_28 = (QRect)(**(code **)(*(long *)&(pQVar4->super_QAbstractScrollArea).super_QFrame.
                                             super_QWidget + 0x1e0))(pQVar4,local_40);
    local_18 = (undefined1  [16])local_28;
    bVar2 = QRect::isNull(in_stack_ffffffffffffff60);
    QVar1 = (QRect)local_18;
    if (!bVar2) {
      QPointer<QAbstractItemView>::operator->((QPointer<QAbstractItemView> *)0x7f9a06);
      this_00 = QAbstractScrollArea::viewport((QAbstractScrollArea *)in_stack_ffffffffffffff60);
      parent = (QWidget *)
               ::QPointer::operator_cast_to_QAbstractItemView_
                         ((QPointer<QAbstractItemView> *)0x7f9a21);
      QPoint::QPoint((QPoint *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                     in_stack_ffffffffffffff58);
      QWidget::mapTo(in_stack_ffffffffffffff80,parent,(QPoint *)this_00);
      QRect::translate(in_stack_ffffffffffffff60,
                       (QPoint *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      QPointer<QAbstractItemView>::operator->((QPointer<QAbstractItemView> *)0x7f9a6d);
      QPoint::QPoint((QPoint *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                     in_stack_ffffffffffffff58);
      QWidget::mapToGlobal(this_00,in_stack_ffffffffffffff68);
      QRect::translate(in_stack_ffffffffffffff60,
                       (QPoint *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      QVar1 = (QRect)local_18;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    local_18 = (undefined1  [16])QVar1;
    __stack_chk_fail();
  }
  return QVar1;
}

Assistant:

QRect QAccessibleTableCell::rect() const
{
    QRect r;
    if (!isValid())
        return r;
    r = view->visualRect(m_index);

    if (!r.isNull()) {
        r.translate(view->viewport()->mapTo(view, QPoint(0,0)));
        r.translate(view->mapToGlobal(QPoint(0, 0)));
    }
    return r;
}